

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::Hub::Hub(Hub *this,bool resolveIncomingNames)

{
  int iVar1;
  int *__pipedes;
  void *pvVar2;
  int *terminationPipes;
  bool resolveIncomingNames_local;
  Hub *this_local;
  
  this->_vptr_Hub = (_func_int **)&PTR__Hub_00151258;
  std::set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>::set
            (&this->streams);
  std::set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>::set
            (&this->dataStreams);
  this->resolveIncomingNames = resolveIncomingNames;
  __pipedes = (int *)operator_new__(8);
  iVar1 = pipe(__pipedes);
  if (iVar1 != 0) {
    abort();
  }
  this->hTerminate = __pipedes;
  pvVar2 = operator_new(0x28);
  this->streamsLock = pvVar2;
  pthread_mutex_init((pthread_mutex_t *)this->streamsLock,(pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

Hub::Hub(const bool resolveIncomingNames) :
		resolveIncomingNames(resolveIncomingNames)
	{
		int* terminationPipes = new int[2];
		if (pipe(terminationPipes) != 0)
			abort();
		hTerminate = terminationPipes;

		streamsLock = new pthread_mutex_t;

		pthread_mutex_init((pthread_mutex_t*)streamsLock, NULL);
	}